

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

Bool mainGtU(UInt32 i1,UInt32 i2,UChar *block,UInt16 *quadrant,UInt32 nblock,Int32 *budget)

{
  int iStack_3c;
  UInt16 s2;
  UInt16 s1;
  UChar c2;
  UChar c1;
  Int32 k;
  Int32 *budget_local;
  UInt32 nblock_local;
  UInt16 *quadrant_local;
  UChar *block_local;
  uint local_10;
  UInt32 i2_local;
  UInt32 i1_local;
  
  if (block[i1] == block[i2]) {
    if (block[i1 + 1] == block[i2 + 1]) {
      if (block[i1 + 2] == block[i2 + 2]) {
        if (block[i1 + 3] == block[i2 + 3]) {
          if (block[i1 + 4] == block[i2 + 4]) {
            if (block[i1 + 5] == block[i2 + 5]) {
              if (block[i1 + 6] == block[i2 + 6]) {
                if (block[i1 + 7] == block[i2 + 7]) {
                  if (block[i1 + 8] == block[i2 + 8]) {
                    if (block[i1 + 9] == block[i2 + 9]) {
                      if (block[i1 + 10] == block[i2 + 10]) {
                        if (block[i1 + 0xb] == block[i2 + 0xb]) {
                          local_10 = i1 + 0xc;
                          block_local._4_4_ = i2 + 0xc;
                          iStack_3c = nblock + 8;
                          do {
                            if (block[local_10] != block[block_local._4_4_]) {
                              return block[block_local._4_4_] < block[local_10];
                            }
                            if (quadrant[local_10] != quadrant[block_local._4_4_]) {
                              return quadrant[block_local._4_4_] < quadrant[local_10];
                            }
                            if (block[local_10 + 1] != block[block_local._4_4_ + 1]) {
                              return block[block_local._4_4_ + 1] < block[local_10 + 1];
                            }
                            if (quadrant[local_10 + 1] != quadrant[block_local._4_4_ + 1]) {
                              return quadrant[block_local._4_4_ + 1] < quadrant[local_10 + 1];
                            }
                            if (block[local_10 + 2] != block[block_local._4_4_ + 2]) {
                              return block[block_local._4_4_ + 2] < block[local_10 + 2];
                            }
                            if (quadrant[local_10 + 2] != quadrant[block_local._4_4_ + 2]) {
                              return quadrant[block_local._4_4_ + 2] < quadrant[local_10 + 2];
                            }
                            if (block[local_10 + 3] != block[block_local._4_4_ + 3]) {
                              return block[block_local._4_4_ + 3] < block[local_10 + 3];
                            }
                            if (quadrant[local_10 + 3] != quadrant[block_local._4_4_ + 3]) {
                              return quadrant[block_local._4_4_ + 3] < quadrant[local_10 + 3];
                            }
                            if (block[local_10 + 4] != block[block_local._4_4_ + 4]) {
                              return block[block_local._4_4_ + 4] < block[local_10 + 4];
                            }
                            if (quadrant[local_10 + 4] != quadrant[block_local._4_4_ + 4]) {
                              return quadrant[block_local._4_4_ + 4] < quadrant[local_10 + 4];
                            }
                            if (block[local_10 + 5] != block[block_local._4_4_ + 5]) {
                              return block[block_local._4_4_ + 5] < block[local_10 + 5];
                            }
                            if (quadrant[local_10 + 5] != quadrant[block_local._4_4_ + 5]) {
                              return quadrant[block_local._4_4_ + 5] < quadrant[local_10 + 5];
                            }
                            if (block[local_10 + 6] != block[block_local._4_4_ + 6]) {
                              return block[block_local._4_4_ + 6] < block[local_10 + 6];
                            }
                            if (quadrant[local_10 + 6] != quadrant[block_local._4_4_ + 6]) {
                              return quadrant[block_local._4_4_ + 6] < quadrant[local_10 + 6];
                            }
                            if (block[local_10 + 7] != block[block_local._4_4_ + 7]) {
                              return block[block_local._4_4_ + 7] < block[local_10 + 7];
                            }
                            if (quadrant[local_10 + 7] != quadrant[block_local._4_4_ + 7]) {
                              return quadrant[block_local._4_4_ + 7] < quadrant[local_10 + 7];
                            }
                            local_10 = local_10 + 8;
                            block_local._4_4_ = block_local._4_4_ + 8;
                            if (nblock <= local_10) {
                              local_10 = local_10 - nblock;
                            }
                            if (nblock <= block_local._4_4_) {
                              block_local._4_4_ = block_local._4_4_ - nblock;
                            }
                            iStack_3c = iStack_3c + -8;
                            *budget = *budget + -1;
                          } while (-1 < iStack_3c);
                          i2_local._3_1_ = false;
                        }
                        else {
                          i2_local._3_1_ = block[i2 + 0xb] < block[i1 + 0xb];
                        }
                      }
                      else {
                        i2_local._3_1_ = block[i2 + 10] < block[i1 + 10];
                      }
                    }
                    else {
                      i2_local._3_1_ = block[i2 + 9] < block[i1 + 9];
                    }
                  }
                  else {
                    i2_local._3_1_ = block[i2 + 8] < block[i1 + 8];
                  }
                }
                else {
                  i2_local._3_1_ = block[i2 + 7] < block[i1 + 7];
                }
              }
              else {
                i2_local._3_1_ = block[i2 + 6] < block[i1 + 6];
              }
            }
            else {
              i2_local._3_1_ = block[i2 + 5] < block[i1 + 5];
            }
          }
          else {
            i2_local._3_1_ = block[i2 + 4] < block[i1 + 4];
          }
        }
        else {
          i2_local._3_1_ = block[i2 + 3] < block[i1 + 3];
        }
      }
      else {
        i2_local._3_1_ = block[i2 + 2] < block[i1 + 2];
      }
    }
    else {
      i2_local._3_1_ = block[i2 + 1] < block[i1 + 1];
    }
  }
  else {
    i2_local._3_1_ = block[i2] < block[i1];
  }
  return i2_local._3_1_;
}

Assistant:

static
__inline__
Bool mainGtU ( UInt32  i1, 
               UInt32  i2,
               UChar*  block, 
               UInt16* quadrant,
               UInt32  nblock,
               Int32*  budget )
{
   Int32  k;
   UChar  c1, c2;
   UInt16 s1, s2;

   AssertD ( i1 != i2, "mainGtU" );
   /* 1 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 2 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 3 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 4 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 5 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 6 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 7 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 8 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 9 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 10 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 11 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 12 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;

   k = nblock + 8;

   do {
      /* 1 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 2 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 3 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 4 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 5 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 6 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 7 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 8 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;

      if (i1 >= nblock) i1 -= nblock;
      if (i2 >= nblock) i2 -= nblock;

      k -= 8;
      (*budget)--;
   }
      while (k >= 0);

   return False;
}